

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O1

void pltcalc::
     dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
               (summarySampleslevelHeader *sh,
               vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *vrec,
               _func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp,
               OASIS_FLOAT max_impacted_exposure,OASIS_FLOAT mean_impacted_exposure,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  pointer ppVar1;
  mapped_type *__x;
  pointer psVar2;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  bool bVar6;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *__range4;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  outrec local_70;
  _func_void_outrec_ptr_int_FILE_ptr *local_40;
  FILE *local_38;
  
  local_40 = OutputData;
  local_38 = outFile;
  __x = std::
        map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
        ::operator[](m_occ,&sh->event_id);
  std::vector<period_occ,_std::allocator<period_occ>_>::operator=(vp,__x);
  local_70.event_id = sh->event_id;
  local_70.summary_id = sh->summary_id;
  local_70.exp_value = sh->expval;
  local_70.mean = 0.0;
  local_70.standard_deviation = 0.0;
  ppVar5 = (vp->super__Vector_base<period_occ,_std::allocator<period_occ>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar1 = (vp->super__Vector_base<period_occ,_std::allocator<period_occ>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    bVar6 = true;
    bVar3 = false;
    bVar4 = false;
    fVar9 = 0.0;
    fVar10 = 0.0;
    local_70.max_impact_exp = max_impacted_exposure;
    local_70.mean_impact_exp = mean_impacted_exposure;
    local_70.chance_of_loss = chance_of_loss;
    local_70.max_loss = max_loss;
    do {
      local_70.period_no = ppVar5->period_no;
      local_70.occ_date_id = ppVar5->occ_date_id;
      if (bVar6) {
        for (psVar2 = (vrec->super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            psVar2 != (vrec->super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>).
                      _M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
          bVar4 = bVar3;
          if (0 < psVar2->sidx) {
            fVar7 = psVar2->loss;
            fVar10 = fVar10 + fVar7;
            fVar9 = fVar9 + fVar7 * fVar7;
            bVar4 = true;
          }
          bVar3 = bVar4;
        }
        bVar6 = false;
      }
      if (bVar4) {
        local_70.mean = fVar10 / (float)samplesize_;
        fVar7 = 0.0;
        if (samplesize_ != 1) {
          fVar8 = (fVar9 - (fVar10 * fVar10) / (float)samplesize_) / (float)(samplesize_ + -1);
          fVar7 = 0.0;
          if (1e-07 <= fVar8 / fVar9) {
            fVar7 = fVar8;
          }
          if (fVar7 < 0.0) {
            fVar7 = sqrtf(fVar7);
          }
          else {
            fVar7 = SQRT(fVar7);
          }
        }
        local_70.standard_deviation = fVar7;
        if ((0.0 < fVar7) || (0.0 < local_70.mean)) {
          (*local_40)(&local_70,2,local_38);
        }
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return;
}

Assistant:

void dopltcalc(const summarySampleslevelHeader& sh,
		       const std::vector<sampleslevelRec>& vrec,
		       void (*OutputData)(const outrecT&, const int, FILE*),
		       FILE * outFile, moccT &m_occ, std::vector<periodT> &vp,
		       const OASIS_FLOAT max_impacted_exposure,
		       const OASIS_FLOAT mean_impacted_exposure,
		       const OASIS_FLOAT chance_of_loss,
		       const OASIS_FLOAT max_loss)
	{
		vp = m_occ[sh.event_id];
		bool hasrec = false;
		bool firsttime = true;
		outrecT o;
		o.event_id = sh.event_id;
		o.summary_id = sh.summary_id;
		o.exp_value = sh.expval;
		o.max_impact_exp = max_impacted_exposure;
		o.mean_impact_exp = mean_impacted_exposure;
		o.chance_of_loss = chance_of_loss;
		o.max_loss = max_loss;
		o.mean = 0;
		o.standard_deviation = 0;

		OASIS_FLOAT squared_loss_sum = 0;
		OASIS_FLOAT loss_sum = 0;
		for (auto p : vp) {
			o.period_no = p.period_no;
			o.occ_date_id = p.occ_date_id;
			if (firsttime == true) { // only do this once
				for (auto v : vrec) {
					if (v.sidx > 0) {
						hasrec = true;
						loss_sum += v.loss;
						squared_loss_sum += (v.loss * v.loss);
					}
				}
				firsttime = false;
			}
			if (hasrec) {
				o.mean = loss_sum / samplesize_;
				if (samplesize_ != 1) {
					OASIS_FLOAT sd = (squared_loss_sum - ((loss_sum * loss_sum) / samplesize_)) / (samplesize_ - 1);
					OASIS_FLOAT x = sd / squared_loss_sum;
					if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
					o.standard_deviation = sqrt(sd);
				} else {
					o.standard_deviation = 0;
				}
				if (o.mean > 0 || o.standard_deviation > 0) {
					OutputData(o, 2, outFile);
				}
			}
		}
	}